

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_rejects_table.cpp
# Opt level: O3

void __thiscall
duckdb::CSVRejectsTable::InitializeTable
          (CSVRejectsTable *this,ClientContext *context,ReadCSVData *data)

{
  long lVar1;
  Catalog *this_00;
  pointer pCVar2;
  type info;
  pointer pCVar3;
  LogicalType enum_type;
  string enum_name;
  Vector order_errors;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_19a0;
  _Head_base<0UL,_duckdb::CreateTypeInfo_*,_false> local_1998;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_1990;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_1988;
  Value local_1980;
  string local_1940;
  Vector local_1920;
  LogicalType local_18b8;
  LogicalType local_18a0;
  LogicalType local_1888;
  LogicalType local_1870;
  LogicalType local_1858;
  LogicalType local_1840;
  LogicalType local_1828;
  LogicalType local_1810;
  LogicalType local_17f8;
  LogicalType local_17e0;
  LogicalType local_17c8;
  LogicalType local_17b0;
  LogicalType local_1798;
  LogicalType local_1780;
  LogicalType local_1768;
  LogicalType local_1750;
  LogicalType local_1738;
  LogicalType local_1720;
  LogicalType local_1708;
  LogicalType local_16f0;
  LogicalType local_16d8;
  LogicalType local_16c0;
  LogicalType local_16a8;
  LogicalType local_1690;
  string local_1678;
  string local_1658;
  string local_1638;
  string local_1618;
  string local_15f8;
  string local_15d8;
  string local_15b8;
  string local_1598;
  string local_1578;
  string local_1558;
  string local_1538;
  string local_1518;
  string local_14f8;
  string local_14d8;
  string local_14b8;
  string local_1498;
  string local_1478;
  string local_1458;
  string local_1438;
  string local_1418;
  string local_13f8;
  string local_13d8;
  string local_13b8;
  undefined1 local_1398 [216];
  undefined1 local_12c0 [216];
  undefined1 local_11e8 [216];
  undefined1 local_1110 [216];
  undefined1 local_1038 [216];
  undefined1 local_f60 [216];
  undefined1 local_e88 [216];
  undefined1 local_db0 [216];
  undefined1 local_cd8 [216];
  undefined1 local_c00 [216];
  undefined1 local_b28 [216];
  undefined1 local_a50 [216];
  undefined1 local_978 [216];
  undefined1 local_8a0 [216];
  undefined1 local_7c8 [216];
  undefined1 local_6f0 [216];
  undefined1 local_618 [216];
  undefined1 local_540 [216];
  undefined1 local_468 [216];
  undefined1 local_390 [216];
  undefined1 local_2b8 [216];
  undefined1 local_1e0 [216];
  undefined1 local_108 [216];
  
  lVar1 = (long)&local_1920.type.type_info_;
  local_1920._0_8_ = lVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1920,"temp","");
  this_00 = Catalog::GetCatalog(context,(string *)&local_1920);
  if (local_1920._0_8_ != lVar1) {
    operator_delete((void *)local_1920._0_8_);
  }
  local_1940._M_dataplus._M_p = (pointer)&local_1940.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1940,"CSV_ERROR_TYPE","");
  LogicalType::LogicalType(&local_1690,VARCHAR);
  Vector::Vector(&local_1920,&local_1690,7);
  LogicalType::~LogicalType(&local_1690);
  Value::Value(&local_1980,"CAST");
  Vector::SetValue(&local_1920,0,&local_1980);
  Value::~Value(&local_1980);
  Value::Value(&local_1980,"MISSING COLUMNS");
  Vector::SetValue(&local_1920,1,&local_1980);
  Value::~Value(&local_1980);
  Value::Value(&local_1980,"TOO MANY COLUMNS");
  Vector::SetValue(&local_1920,2,&local_1980);
  Value::~Value(&local_1980);
  Value::Value(&local_1980,"UNQUOTED VALUE");
  Vector::SetValue(&local_1920,3,&local_1980);
  Value::~Value(&local_1980);
  Value::Value(&local_1980,"LINE SIZE OVER MAXIMUM");
  Vector::SetValue(&local_1920,4,&local_1980);
  Value::~Value(&local_1980);
  Value::Value(&local_1980,"INVALID ENCODING");
  Vector::SetValue(&local_1920,5,&local_1980);
  Value::~Value(&local_1980);
  Value::Value(&local_1980,"INVALID STATE");
  Vector::SetValue(&local_1920,6,&local_1980);
  Value::~Value(&local_1980);
  LogicalType::ENUM(&local_1980.type_,&local_1940,&local_1920,7);
  make_uniq<duckdb::CreateTypeInfo,std::__cxx11::string&,duckdb::LogicalType&>
            ((duckdb *)&local_1998,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1940,
             &local_1980.type_);
  pCVar2 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                       *)&local_1998);
  (pCVar2->super_CreateInfo).temporary = true;
  pCVar2 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                       *)&local_1998);
  (pCVar2->super_CreateInfo).on_conflict = IGNORE_ON_CONFLICT;
  info = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
         operator*((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                    *)&local_1998);
  Catalog::CreateType(this_00,context,info);
  make_uniq<duckdb::CreateTableInfo,char_const(&)[5],char_const(&)[5],std::__cxx11::string&>
            ((duckdb *)&local_19a0,(char (*) [5])"temp",(char (*) [5])0x1edb74b,&this->scan_table);
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  (pCVar3->super_CreateInfo).temporary = true;
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  (pCVar3->super_CreateInfo).on_conflict = IGNORE_ON_CONFLICT;
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_13b8._M_dataplus._M_p = (pointer)&local_13b8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_13b8,"scan_id","");
  LogicalType::LogicalType(&local_16a8,UBIGINT);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_108,&local_13b8,&local_16a8);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_108);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_108 + 0xa0));
  Value::~Value((Value *)(local_108 + 0x60));
  if ((tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
      local_108._88_8_ != (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
    (**(code **)(*(long *)local_108._88_8_ + 8))();
  }
  local_108._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_108 + 0x20));
  if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
    operator_delete((void *)local_108._0_8_);
  }
  LogicalType::~LogicalType(&local_16a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13b8._M_dataplus._M_p != &local_13b8.field_2) {
    operator_delete(local_13b8._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_13d8._M_dataplus._M_p = (pointer)&local_13d8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_13d8,"file_id","");
  LogicalType::LogicalType(&local_16c0,UBIGINT);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_1e0,&local_13d8,&local_16c0);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_1e0);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_1e0 + 0xa0));
  Value::~Value((Value *)(local_1e0 + 0x60));
  if ((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
      local_1e0._88_8_ !=
      (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)0x0
     ) {
    (**(code **)(*(long *)local_1e0._88_8_ + 8))();
  }
  local_1e0._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_1e0 + 0x20));
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_);
  }
  LogicalType::~LogicalType(&local_16c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13d8._M_dataplus._M_p != &local_13d8.field_2) {
    operator_delete(local_13d8._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_13f8._M_dataplus._M_p = (pointer)&local_13f8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_13f8,"file_path","");
  LogicalType::LogicalType(&local_16d8,VARCHAR);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_2b8,&local_13f8,&local_16d8);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_2b8);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_2b8 + 0xa0));
  Value::~Value((Value *)(local_2b8 + 0x60));
  if ((ParsedExpression *)local_2b8._88_8_ != (ParsedExpression *)0x0) {
    (*((BaseExpression *)local_2b8._88_8_)->_vptr_BaseExpression[1])();
  }
  local_2b8._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_2b8 + 0x20));
  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
    operator_delete((void *)local_2b8._0_8_);
  }
  LogicalType::~LogicalType(&local_16d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13f8._M_dataplus._M_p != &local_13f8.field_2) {
    operator_delete(local_13f8._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_1418._M_dataplus._M_p = (pointer)&local_1418.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1418,"delimiter","");
  LogicalType::LogicalType(&local_16f0,VARCHAR);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_390,&local_1418,&local_16f0);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_390);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_390 + 0xa0));
  Value::~Value((Value *)(local_390 + 0x60));
  if ((ParsedExpression *)local_390._88_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_390._88_8_ + 8))();
  }
  local_390._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_390 + 0x20));
  if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
    operator_delete((void *)local_390._0_8_);
  }
  LogicalType::~LogicalType(&local_16f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1418._M_dataplus._M_p != &local_1418.field_2) {
    operator_delete(local_1418._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_1438._M_dataplus._M_p = (pointer)&local_1438.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1438,"quote","");
  LogicalType::LogicalType(&local_1708,VARCHAR);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_468,&local_1438,&local_1708);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_468);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_468 + 0xa0));
  Value::~Value((Value *)(local_468 + 0x60));
  if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
      local_468._88_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_468._88_8_ + 8))();
  }
  local_468._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_468 + 0x20));
  if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
    operator_delete((void *)local_468._0_8_);
  }
  LogicalType::~LogicalType(&local_1708);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1438._M_dataplus._M_p != &local_1438.field_2) {
    operator_delete(local_1438._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_1458._M_dataplus._M_p = (pointer)&local_1458.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1458,"escape","");
  LogicalType::LogicalType(&local_1720,VARCHAR);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_540,&local_1458,&local_1720);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_540);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_540 + 0xa0));
  Value::~Value((Value *)(local_540 + 0x60));
  if ((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
      local_540._88_8_ !=
      (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)0x0
     ) {
    (**(code **)(*(long *)local_540._88_8_ + 8))();
  }
  local_540._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_540 + 0x20));
  if ((undefined1 *)local_540._0_8_ != local_540 + 0x10) {
    operator_delete((void *)local_540._0_8_);
  }
  LogicalType::~LogicalType(&local_1720);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1458._M_dataplus._M_p != &local_1458.field_2) {
    operator_delete(local_1458._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_1478._M_dataplus._M_p = (pointer)&local_1478.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1478,"newline_delimiter","");
  LogicalType::LogicalType(&local_1738,VARCHAR);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_618,&local_1478,&local_1738);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_618);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_618 + 0xa0));
  Value::~Value((Value *)(local_618 + 0x60));
  if ((ParsedExpression *)local_618._88_8_ != (ParsedExpression *)0x0) {
    (*((BaseExpression *)local_618._88_8_)->_vptr_BaseExpression[1])();
  }
  local_618._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_618 + 0x20));
  if ((undefined1 *)local_618._0_8_ != local_618 + 0x10) {
    operator_delete((void *)local_618._0_8_);
  }
  LogicalType::~LogicalType(&local_1738);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1478._M_dataplus._M_p != &local_1478.field_2) {
    operator_delete(local_1478._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_1498._M_dataplus._M_p = (pointer)&local_1498.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1498,"skip_rows","");
  LogicalType::LogicalType(&local_1750,UINTEGER);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_6f0,&local_1498,&local_1750);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_6f0);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_6f0 + 0xa0));
  Value::~Value((Value *)(local_6f0 + 0x60));
  if ((ParsedExpression *)local_6f0._88_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_6f0._88_8_ + 8))();
  }
  local_6f0._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_6f0 + 0x20));
  if ((undefined1 *)local_6f0._0_8_ != local_6f0 + 0x10) {
    operator_delete((void *)local_6f0._0_8_);
  }
  LogicalType::~LogicalType(&local_1750);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1498._M_dataplus._M_p != &local_1498.field_2) {
    operator_delete(local_1498._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_14b8._M_dataplus._M_p = (pointer)&local_14b8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_14b8,"has_header","");
  LogicalType::LogicalType(&local_1768,BOOLEAN);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_7c8,&local_14b8,&local_1768);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_7c8);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_7c8 + 0xa0));
  Value::~Value((Value *)(local_7c8 + 0x60));
  if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
      local_7c8._88_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_7c8._88_8_ + 8))();
  }
  local_7c8._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_7c8 + 0x20));
  if ((undefined1 *)local_7c8._0_8_ != local_7c8 + 0x10) {
    operator_delete((void *)local_7c8._0_8_);
  }
  LogicalType::~LogicalType(&local_1768);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14b8._M_dataplus._M_p != &local_14b8.field_2) {
    operator_delete(local_14b8._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_14d8._M_dataplus._M_p = (pointer)&local_14d8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_14d8,"columns","");
  LogicalType::LogicalType(&local_1780,VARCHAR);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_8a0,&local_14d8,&local_1780);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_8a0);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_8a0 + 0xa0));
  Value::~Value((Value *)(local_8a0 + 0x60));
  if ((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
      local_8a0._88_8_ !=
      (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)0x0
     ) {
    (**(code **)(*(long *)local_8a0._88_8_ + 8))();
  }
  local_8a0._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_8a0 + 0x20));
  if ((undefined1 *)local_8a0._0_8_ != local_8a0 + 0x10) {
    operator_delete((void *)local_8a0._0_8_);
  }
  LogicalType::~LogicalType(&local_1780);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14d8._M_dataplus._M_p != &local_14d8.field_2) {
    operator_delete(local_14d8._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_14f8._M_dataplus._M_p = (pointer)&local_14f8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_14f8,"date_format","");
  LogicalType::LogicalType(&local_1798,VARCHAR);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_978,&local_14f8,&local_1798);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_978);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_978 + 0xa0));
  Value::~Value((Value *)(local_978 + 0x60));
  if ((ParsedExpression *)local_978._88_8_ != (ParsedExpression *)0x0) {
    (*((BaseExpression *)local_978._88_8_)->_vptr_BaseExpression[1])();
  }
  local_978._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_978 + 0x20));
  if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
    operator_delete((void *)local_978._0_8_);
  }
  LogicalType::~LogicalType(&local_1798);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14f8._M_dataplus._M_p != &local_14f8.field_2) {
    operator_delete(local_14f8._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_1518._M_dataplus._M_p = (pointer)&local_1518.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1518,"timestamp_format","");
  LogicalType::LogicalType(&local_17b0,VARCHAR);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_a50,&local_1518,&local_17b0);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_a50);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_a50 + 0xa0));
  Value::~Value((Value *)(local_a50 + 0x60));
  if ((ParsedExpression *)local_a50._88_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_a50._88_8_ + 8))();
  }
  local_a50._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_a50 + 0x20));
  if ((undefined1 *)local_a50._0_8_ != local_a50 + 0x10) {
    operator_delete((void *)local_a50._0_8_);
  }
  LogicalType::~LogicalType(&local_17b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1518._M_dataplus._M_p != &local_1518.field_2) {
    operator_delete(local_1518._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_1538._M_dataplus._M_p = (pointer)&local_1538.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1538,"user_arguments","");
  LogicalType::LogicalType(&local_17c8,VARCHAR);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_b28,&local_1538,&local_17c8);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_b28);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_b28 + 0xa0));
  Value::~Value((Value *)(local_b28 + 0x60));
  if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
      local_b28._88_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_b28._88_8_ + 8))();
  }
  local_b28._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_b28 + 0x20));
  if ((undefined1 *)local_b28._0_8_ != local_b28 + 0x10) {
    operator_delete((void *)local_b28._0_8_);
  }
  LogicalType::~LogicalType(&local_17c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1538._M_dataplus._M_p != &local_1538.field_2) {
    operator_delete(local_1538._M_dataplus._M_p);
  }
  local_1988._M_head_impl = local_19a0._M_head_impl;
  local_19a0._M_head_impl = (CreateTableInfo *)0x0;
  Catalog::CreateTable
            (this_00,context,
             (unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
              *)&local_1988);
  if (local_1988._M_head_impl != (CreateTableInfo *)0x0) {
    (*((local_1988._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  local_1988._M_head_impl = (CreateTableInfo *)0x0;
  if (local_19a0._M_head_impl != (CreateTableInfo *)0x0) {
    (*((local_19a0._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  make_uniq<duckdb::CreateTableInfo,char_const(&)[5],char_const(&)[5],std::__cxx11::string&>
            ((duckdb *)&local_19a0,(char (*) [5])"temp",(char (*) [5])0x1edb74b,&this->errors_table)
  ;
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  (pCVar3->super_CreateInfo).temporary = true;
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  (pCVar3->super_CreateInfo).on_conflict = IGNORE_ON_CONFLICT;
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_1558._M_dataplus._M_p = (pointer)&local_1558.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1558,"scan_id","");
  LogicalType::LogicalType(&local_17e0,UBIGINT);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_c00,&local_1558,&local_17e0);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_c00);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_c00 + 0xa0));
  Value::~Value((Value *)(local_c00 + 0x60));
  if ((__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
       )local_c00._88_8_ !=
      (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)0x0) {
    (**(code **)(*(long *)local_c00._88_8_ + 8))();
  }
  local_c00._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_c00 + 0x20));
  if ((undefined1 *)local_c00._0_8_ != local_c00 + 0x10) {
    operator_delete((void *)local_c00._0_8_);
  }
  LogicalType::~LogicalType(&local_17e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1558._M_dataplus._M_p != &local_1558.field_2) {
    operator_delete(local_1558._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_1578._M_dataplus._M_p = (pointer)&local_1578.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1578,"file_id","");
  LogicalType::LogicalType(&local_17f8,UBIGINT);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_cd8,&local_1578,&local_17f8);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_cd8);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_cd8 + 0xa0));
  Value::~Value((Value *)(local_cd8 + 0x60));
  if ((ParsedExpression *)local_cd8._88_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_cd8._88_8_ + 8))();
  }
  local_cd8._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_cd8 + 0x20));
  if ((undefined1 *)local_cd8._0_8_ != local_cd8 + 0x10) {
    operator_delete((void *)local_cd8._0_8_);
  }
  LogicalType::~LogicalType(&local_17f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1578._M_dataplus._M_p != &local_1578.field_2) {
    operator_delete(local_1578._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_1598._M_dataplus._M_p = (pointer)&local_1598.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1598,"line","");
  LogicalType::LogicalType(&local_1810,UBIGINT);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_db0,&local_1598,&local_1810);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_db0);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_db0 + 0xa0));
  Value::~Value((Value *)(local_db0 + 0x60));
  if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
      local_db0._88_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_db0._88_8_ + 8))();
  }
  local_db0._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_db0 + 0x20));
  if ((undefined1 *)local_db0._0_8_ != local_db0 + 0x10) {
    operator_delete((void *)local_db0._0_8_);
  }
  LogicalType::~LogicalType(&local_1810);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1598._M_dataplus._M_p != &local_1598.field_2) {
    operator_delete(local_1598._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_15b8._M_dataplus._M_p = (pointer)&local_15b8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_15b8,"line_byte_position","");
  LogicalType::LogicalType(&local_1828,UBIGINT);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_e88,&local_15b8,&local_1828);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_e88);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_e88 + 0xa0));
  Value::~Value((Value *)(local_e88 + 0x60));
  if ((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
      local_e88._88_8_ !=
      (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)0x0
     ) {
    (**(code **)(*(long *)local_e88._88_8_ + 8))();
  }
  local_e88._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_e88 + 0x20));
  if ((undefined1 *)local_e88._0_8_ != local_e88 + 0x10) {
    operator_delete((void *)local_e88._0_8_);
  }
  LogicalType::~LogicalType(&local_1828);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15b8._M_dataplus._M_p != &local_15b8.field_2) {
    operator_delete(local_15b8._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_15d8._M_dataplus._M_p = (pointer)&local_15d8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_15d8,"byte_position","");
  LogicalType::LogicalType(&local_1840,UBIGINT);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_f60,&local_15d8,&local_1840);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_f60);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_f60 + 0xa0));
  Value::~Value((Value *)(local_f60 + 0x60));
  if ((ParsedExpression *)local_f60._88_8_ != (ParsedExpression *)0x0) {
    (*((BaseExpression *)local_f60._88_8_)->_vptr_BaseExpression[1])();
  }
  local_f60._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_f60 + 0x20));
  if ((undefined1 *)local_f60._0_8_ != local_f60 + 0x10) {
    operator_delete((void *)local_f60._0_8_);
  }
  LogicalType::~LogicalType(&local_1840);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15d8._M_dataplus._M_p != &local_15d8.field_2) {
    operator_delete(local_15d8._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_15f8._M_dataplus._M_p = (pointer)&local_15f8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_15f8,"column_idx","");
  LogicalType::LogicalType(&local_1858,UBIGINT);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_1038,&local_15f8,&local_1858);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_1038);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_1038 + 0xa0));
  Value::~Value((Value *)(local_1038 + 0x60));
  if ((ParsedExpression *)local_1038._88_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_1038._88_8_ + 8))();
  }
  local_1038._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_1038 + 0x20));
  if ((undefined1 *)local_1038._0_8_ != local_1038 + 0x10) {
    operator_delete((void *)local_1038._0_8_);
  }
  LogicalType::~LogicalType(&local_1858);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15f8._M_dataplus._M_p != &local_15f8.field_2) {
    operator_delete(local_15f8._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_1618._M_dataplus._M_p = (pointer)&local_1618.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1618,"column_name","");
  LogicalType::LogicalType(&local_1870,VARCHAR);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_1110,&local_1618,&local_1870);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_1110);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_1110 + 0xa0));
  Value::~Value((Value *)(local_1110 + 0x60));
  if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
      local_1110._88_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_1110._88_8_ + 8))();
  }
  local_1110._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_1110 + 0x20));
  if ((undefined1 *)local_1110._0_8_ != local_1110 + 0x10) {
    operator_delete((void *)local_1110._0_8_);
  }
  LogicalType::~LogicalType(&local_1870);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1618._M_dataplus._M_p != &local_1618.field_2) {
    operator_delete(local_1618._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_1638._M_dataplus._M_p = (pointer)&local_1638.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1638,"error_type","");
  LogicalType::LogicalType(&local_1888,&local_1980.type_);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_11e8,&local_1638,&local_1888);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_11e8);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_11e8 + 0xa0));
  Value::~Value((Value *)(local_11e8 + 0x60));
  if ((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
      local_11e8._88_8_ !=
      (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)0x0
     ) {
    (**(code **)(*(long *)local_11e8._88_8_ + 8))();
  }
  local_11e8._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_11e8 + 0x20));
  if ((undefined1 *)local_11e8._0_8_ != local_11e8 + 0x10) {
    operator_delete((void *)local_11e8._0_8_);
  }
  LogicalType::~LogicalType(&local_1888);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1638._M_dataplus._M_p != &local_1638.field_2) {
    operator_delete(local_1638._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_1658._M_dataplus._M_p = (pointer)&local_1658.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1658,"csv_line","");
  LogicalType::LogicalType(&local_18a0,VARCHAR);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_12c0,&local_1658,&local_18a0);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_12c0);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_12c0 + 0xa0));
  Value::~Value((Value *)(local_12c0 + 0x60));
  if ((ParsedExpression *)local_12c0._88_8_ != (ParsedExpression *)0x0) {
    (*((BaseExpression *)local_12c0._88_8_)->_vptr_BaseExpression[1])();
  }
  local_12c0._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_12c0 + 0x20));
  if ((undefined1 *)local_12c0._0_8_ != local_12c0 + 0x10) {
    operator_delete((void *)local_12c0._0_8_);
  }
  LogicalType::~LogicalType(&local_18a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1658._M_dataplus._M_p != &local_1658.field_2) {
    operator_delete(local_1658._M_dataplus._M_p);
  }
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_19a0);
  local_1678._M_dataplus._M_p = (pointer)&local_1678.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1678,"error_message","");
  LogicalType::LogicalType(&local_18b8,VARCHAR);
  ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_1398,&local_1678,&local_18b8);
  ColumnList::AddColumn(&pCVar3->columns,(ColumnDefinition *)local_1398);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_1398 + 0xa0));
  Value::~Value((Value *)(local_1398 + 0x60));
  if ((ParsedExpression *)local_1398._88_8_ != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_1398._88_8_ + 8))();
  }
  local_1398._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_1398 + 0x20));
  if ((undefined1 *)local_1398._0_8_ != local_1398 + 0x10) {
    operator_delete((void *)local_1398._0_8_);
  }
  LogicalType::~LogicalType(&local_18b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1678._M_dataplus._M_p != &local_1678.field_2) {
    operator_delete(local_1678._M_dataplus._M_p);
  }
  local_1990._M_head_impl = local_19a0._M_head_impl;
  local_19a0._M_head_impl = (CreateTableInfo *)0x0;
  Catalog::CreateTable
            (this_00,context,
             (unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
              *)&local_1990);
  if (local_1990._M_head_impl != (CreateTableInfo *)0x0) {
    (*((local_1990._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  local_1990._M_head_impl = (CreateTableInfo *)0x0;
  if (local_19a0._M_head_impl != (CreateTableInfo *)0x0) {
    (*((local_19a0._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  this->count = 0;
  if (local_1998._M_head_impl != (CreateTypeInfo *)0x0) {
    (*((local_1998._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  LogicalType::~LogicalType(&local_1980.type_);
  if (local_1920.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1920.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_1920.buffer.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1920.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_1920.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1920.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType((LogicalType *)((long)&local_1920 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1940._M_dataplus._M_p != &local_1940.field_2) {
    operator_delete(local_1940._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CSVRejectsTable::InitializeTable(ClientContext &context, const ReadCSVData &data) {
	// (Re)Create the temporary rejects table
	auto &catalog = Catalog::GetCatalog(context, TEMP_CATALOG);

	// Create CSV_ERROR_TYPE ENUM
	string enum_name = "CSV_ERROR_TYPE";
	constexpr uint8_t number_of_accepted_errors = 7;
	Vector order_errors(LogicalType::VARCHAR, number_of_accepted_errors);
	order_errors.SetValue(0, "CAST");
	order_errors.SetValue(1, "MISSING COLUMNS");
	order_errors.SetValue(2, "TOO MANY COLUMNS");
	order_errors.SetValue(3, "UNQUOTED VALUE");
	order_errors.SetValue(4, "LINE SIZE OVER MAXIMUM");
	order_errors.SetValue(5, "INVALID ENCODING");
	order_errors.SetValue(6, "INVALID STATE");

	LogicalType enum_type = LogicalType::ENUM(enum_name, order_errors, number_of_accepted_errors);
	auto type_info = make_uniq<CreateTypeInfo>(enum_name, enum_type);
	type_info->temporary = true;
	type_info->on_conflict = OnCreateConflict::IGNORE_ON_CONFLICT;
	catalog.CreateType(context, *type_info);

	// Create Rejects Scans Table
	{
		auto info = make_uniq<CreateTableInfo>(TEMP_CATALOG, DEFAULT_SCHEMA, scan_table);
		info->temporary = true;
		info->on_conflict = OnCreateConflict::IGNORE_ON_CONFLICT;
		// 0. Scan ID
		info->columns.AddColumn(ColumnDefinition("scan_id", LogicalType::UBIGINT));
		// 1. File ID (within the scan)
		info->columns.AddColumn(ColumnDefinition("file_id", LogicalType::UBIGINT));
		// 2. File Path
		info->columns.AddColumn(ColumnDefinition("file_path", LogicalType::VARCHAR));
		// 3. Delimiter
		info->columns.AddColumn(ColumnDefinition("delimiter", LogicalType::VARCHAR));
		// 4. Quote
		info->columns.AddColumn(ColumnDefinition("quote", LogicalType::VARCHAR));
		// 5. Escape
		info->columns.AddColumn(ColumnDefinition("escape", LogicalType::VARCHAR));
		// 6. NewLine Delimiter
		info->columns.AddColumn(ColumnDefinition("newline_delimiter", LogicalType::VARCHAR));
		// 7. Skip Rows
		info->columns.AddColumn(ColumnDefinition("skip_rows", LogicalType::UINTEGER));
		// 8. Has Header
		info->columns.AddColumn(ColumnDefinition("has_header", LogicalType::BOOLEAN));
		// 9. List<Struct<Column-Name:Types>>
		info->columns.AddColumn(ColumnDefinition("columns", LogicalType::VARCHAR));
		// 10. Date Format
		info->columns.AddColumn(ColumnDefinition("date_format", LogicalType::VARCHAR));
		// 11. Timestamp Format
		info->columns.AddColumn(ColumnDefinition("timestamp_format", LogicalType::VARCHAR));
		// 12. CSV read function with all the options used
		info->columns.AddColumn(ColumnDefinition("user_arguments", LogicalType::VARCHAR));
		catalog.CreateTable(context, std::move(info));
	}
	{
		// Create Rejects Error Table
		auto info = make_uniq<CreateTableInfo>(TEMP_CATALOG, DEFAULT_SCHEMA, errors_table);
		info->temporary = true;
		info->on_conflict = OnCreateConflict::IGNORE_ON_CONFLICT;
		// 0. Scan ID
		info->columns.AddColumn(ColumnDefinition("scan_id", LogicalType::UBIGINT));
		// 1. File ID (within the scan)
		info->columns.AddColumn(ColumnDefinition("file_id", LogicalType::UBIGINT));
		// 2. Row Line
		info->columns.AddColumn(ColumnDefinition("line", LogicalType::UBIGINT));
		// 3. Byte Position of the start of the line
		info->columns.AddColumn(ColumnDefinition("line_byte_position", LogicalType::UBIGINT));
		// 4. Byte Position where error occurred
		info->columns.AddColumn(ColumnDefinition("byte_position", LogicalType::UBIGINT));
		// 5. Column Index (If Applicable)
		info->columns.AddColumn(ColumnDefinition("column_idx", LogicalType::UBIGINT));
		// 6. Column Name (If Applicable)
		info->columns.AddColumn(ColumnDefinition("column_name", LogicalType::VARCHAR));
		// 7. Error Type
		info->columns.AddColumn(ColumnDefinition("error_type", enum_type));
		// 8. Original CSV Line
		info->columns.AddColumn(ColumnDefinition("csv_line", LogicalType::VARCHAR));
		// 9. Full Error Message
		info->columns.AddColumn(ColumnDefinition("error_message", LogicalType::VARCHAR));
		catalog.CreateTable(context, std::move(info));
	}

	count = 0;
}